

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

int __thiscall CommandLineTestRunner::runAllTests(CommandLineTestRunner *this)

{
  long *plVar1;
  bool bVar2;
  size_t sVar3;
  long in_RDI;
  TestResult tr_2;
  TestResult tr_1;
  TestResult tr;
  size_t repeatCount;
  size_t failedExecutionCount;
  size_t failedTestCount;
  size_t loopCount;
  int local_1d8;
  CommandLineTestRunner *in_stack_fffffffffffffe40;
  TestResult *this_00;
  TestResult local_190;
  TestResult local_120;
  TestResult local_a0;
  size_t local_30;
  long local_28;
  long local_20;
  ulong local_18;
  int local_4;
  
  initializeTestRun(in_stack_fffffffffffffe40);
  local_18 = 0;
  local_20 = 0;
  local_28 = 0;
  local_30 = CommandLineArguments::getRepeatCount(*(CommandLineArguments **)(in_RDI + 0x10));
  bVar2 = CommandLineArguments::isListingTestGroupNames(*(CommandLineArguments **)(in_RDI + 0x10));
  if (bVar2) {
    TestResult::TestResult(&local_a0,*(TestOutput **)(in_RDI + 8));
    (**(code **)(**(long **)(in_RDI + 0x18) + 0x40))(*(long **)(in_RDI + 0x18),&local_a0);
    local_4 = 0;
    TestResult::~TestResult(&local_a0);
  }
  else {
    bVar2 = CommandLineArguments::isListingTestGroupAndCaseNames
                      (*(CommandLineArguments **)(in_RDI + 0x10));
    if (bVar2) {
      TestResult::TestResult(&local_120,*(TestOutput **)(in_RDI + 8));
      (**(code **)(**(long **)(in_RDI + 0x18) + 0x48))(*(long **)(in_RDI + 0x18),&local_120);
      local_4 = 0;
      TestResult::~TestResult(&local_120);
    }
    else {
      bVar2 = CommandLineArguments::isReversing(*(CommandLineArguments **)(in_RDI + 0x10));
      if (bVar2) {
        (**(code **)(**(long **)(in_RDI + 0x18) + 0x38))();
      }
      bVar2 = CommandLineArguments::isShuffling(*(CommandLineArguments **)(in_RDI + 0x10));
      if (bVar2) {
        (**(code **)(**(long **)(in_RDI + 8) + 0x58))
                  (*(long **)(in_RDI + 8),"Test order shuffling enabled with seed: ");
        plVar1 = *(long **)(in_RDI + 8);
        sVar3 = CommandLineArguments::getShuffleSeed(*(CommandLineArguments **)(in_RDI + 0x10));
        (**(code **)(*plVar1 + 0x68))(plVar1,sVar3);
        (**(code **)(**(long **)(in_RDI + 8) + 0x58))(*(long **)(in_RDI + 8),"\n");
      }
      while (local_18 < local_30) {
        local_18 = local_18 + 1;
        bVar2 = CommandLineArguments::isShuffling(*(CommandLineArguments **)(in_RDI + 0x10));
        if (bVar2) {
          plVar1 = *(long **)(in_RDI + 0x18);
          sVar3 = CommandLineArguments::getShuffleSeed(*(CommandLineArguments **)(in_RDI + 0x10));
          (**(code **)(*plVar1 + 0x30))(plVar1,sVar3);
        }
        (**(code **)(**(long **)(in_RDI + 8) + 0x80))(*(long **)(in_RDI + 8),local_18,local_30);
        this_00 = &local_190;
        TestResult::TestResult(this_00,*(TestOutput **)(in_RDI + 8));
        (**(code **)(**(long **)(in_RDI + 0x18) + 0x28))(*(long **)(in_RDI + 0x18),this_00);
        sVar3 = TestResult::getFailureCount(&local_190);
        local_20 = local_20 + sVar3;
        bVar2 = TestResult::isFailure(this_00);
        if (bVar2) {
          local_28 = local_28 + 1;
        }
        TestResult::~TestResult(&local_190);
      }
      if (local_20 == 0) {
        local_1d8 = (int)local_28;
      }
      else {
        local_1d8 = (int)local_20;
      }
      local_4 = local_1d8;
    }
  }
  return local_4;
}

Assistant:

int CommandLineTestRunner::runAllTests()
{
    initializeTestRun();
    size_t loopCount = 0;
    size_t failedTestCount = 0;
    size_t failedExecutionCount = 0;
    size_t repeatCount = arguments_->getRepeatCount();

    if (arguments_->isListingTestGroupNames())
    {
        TestResult tr(*output_);
        registry_->listTestGroupNames(tr);
        return 0;
    }

    if (arguments_->isListingTestGroupAndCaseNames())
    {
        TestResult tr(*output_);
        registry_->listTestGroupAndCaseNames(tr);
        return 0;
    }

    if (arguments_->isReversing())
        registry_->reverseTests();

    if (arguments_->isShuffling())
    {
        output_->print("Test order shuffling enabled with seed: ");
        output_->print(arguments_->getShuffleSeed());
        output_->print("\n");
    }
    while (loopCount++ < repeatCount) {

        if (arguments_->isShuffling())
            registry_->shuffleTests(arguments_->getShuffleSeed());

        output_->printTestRun(loopCount, repeatCount);
        TestResult tr(*output_);
        registry_->runAllTests(tr);
        failedTestCount += tr.getFailureCount();
        if (tr.isFailure()) {
            failedExecutionCount++;
        }
    }
    return (int) (failedTestCount != 0 ? failedTestCount : failedExecutionCount);
}